

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O1

void QtGuiTest::setKeyboardModifiers(KeyboardModifiers modifiers)

{
  QDebug this;
  QInputDeviceManager *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QInputDeviceManager *)inputDeviceManager();
  if (this_00 != (QInputDeviceManager *)0x0) {
    QInputDeviceManager::setKeyboardModifiers(this_00,modifiers);
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      QMessageLogger::debug();
      this.stream = local_50.stream;
      QVar1.m_data = (storage_type *)0x1f;
      QVar1.m_size = (qsizetype)&local_38;
      QString::fromUtf8(QVar1);
      QTextStream::operator<<(&(this.stream)->ts,&local_38);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((local_50.stream)->space == true) {
        QTextStream::operator<<(&(local_50.stream)->ts,' ');
      }
      local_48.stream = local_50.stream;
      (local_50.stream)->ref = (local_50.stream)->ref + 1;
      qt_QMetaEnum_flagDebugOperator
                ((QDebug *)&local_40,(ulonglong)&local_48,
                 (QMetaObject *)
                 (ulong)(uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                              super_QFlagsStorage<Qt::KeyboardModifier>.i,
                 (char *)&Qt::staticMetaObject);
      QDebug::~QDebug(&local_40);
      QDebug::~QDebug(&local_48);
      QDebug::~QDebug(&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QtGuiTest::setKeyboardModifiers(Qt::KeyboardModifiers modifiers)
{
    auto *idm = inputDeviceManager();
    if (Q_UNLIKELY(!idm))
        return;

    idm->setKeyboardModifiers(modifiers);
    deb << "Keyboard modifiers synthesized:" << modifiers;
}